

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O0

void last_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  int *accum_aux_local;
  int *accum_local;
  int *auxs_local;
  int *vals_local;
  int n_local;
  
  if (n < 1) {
    *accum = 0x7ffffffe;
    *accum_aux = 0x7ffffffe;
  }
  else {
    *accum = vals[n + -1];
    *accum_aux = auxs[n + -1];
  }
  return;
}

Assistant:

static void last_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	if (n > 0) {
		*accum = vals[n - 1];
		*accum_aux = auxs[n - 1];
	} else {
		*accum = UI_ENTRY_VALUE_NOT_PRESENT;
		*accum_aux = UI_ENTRY_VALUE_NOT_PRESENT;
	}
}